

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

Tree * new_tree(List *list)

{
  void *any;
  Tree *pTVar1;
  TreeNode *pTVar2;
  Tree *tree;
  List *list_local;
  
  any = malloc(0x18);
  pTVar1 = (Tree *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node((Token *)0x0,tree_eval);
  (pTVar1->node).eval = pTVar2->eval;
  (pTVar1->node).token = pTVar2->token;
  pTVar1->stmts = list;
  return pTVar1;
}

Assistant:

Tree *new_tree(List *list) {
    Tree *tree = new(Tree);
    tree->node = tree_node_(NULL,eval_handler(tree_eval));
    tree->stmts = list;
    return tree;
}